

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall kratos::AuxiliaryStmt::AuxiliaryStmt(AuxiliaryStmt *this,AuxiliaryType type)

{
  Stmt::Stmt(&this->super_Stmt,Auxiliary);
  (this->super_Stmt).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_0057ad98;
  this->type_ = type;
  return;
}

Assistant:

AuxiliaryStmt::AuxiliaryStmt(AuxiliaryType type) : Stmt(StatementType::Auxiliary), type_(type) {}